

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ijgp.cpp
# Opt level: O0

Factor * __thiscall libDAI::IJGP::belief(IJGP *this,VarSet *ns)

{
  bool bVar1;
  pointer pTVar2;
  undefined8 in_RDX;
  VarSet *in_RSI;
  Factor *in_RDI;
  const_iterator alpha;
  const_iterator beta;
  Factor *this_00;
  __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
  local_48;
  TFactor<double> *local_40;
  TFactor<double> *local_38;
  TFactor<double> *local_30;
  TFactor<double> *local_28;
  __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
  local_20;
  undefined1 uVar3;
  VarSet *ns_00;
  Factor *this_01;
  
  this_00 = in_RDI;
  ns_00 = in_RSI;
  this_01 = in_RDI;
  __gnu_cxx::
  __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
  ::__normal_iterator(&local_20);
  local_28 = (TFactor<double> *)
             std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::begin
                       ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         *)in_RDI);
  local_20._M_current = local_28;
  while( true ) {
    local_30 = (TFactor<double> *)
               std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::end
                         ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           *)in_RDI);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                        *)this_00,
                       (__normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
             ::operator->(&local_20);
    TFactor<double>::vars(pTVar2);
    bVar1 = VarSet::operator>>(&this_00->_vs,&in_RDI->_vs);
    if (bVar1) break;
    local_38 = (TFactor<double> *)
               __gnu_cxx::
               __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
               ::operator++((__normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                             *)in_RSI,(int)((ulong)this_00 >> 0x20));
  }
  local_40 = (TFactor<double> *)
             std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::end
                       ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         *)in_RDI);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                      *)this_00,
                     (__normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                      *)in_RDI);
  uVar3 = (undefined1)((ulong)in_RDX >> 0x38);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
    ::operator->(&local_20);
    TFactor<double>::marginal(this_01,ns_00,(bool)uVar3);
  }
  else {
    __gnu_cxx::
    __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
    ::__normal_iterator(&local_48);
    local_48._M_current =
         (TFactor<double> *)
         std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::begin
                   ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                    in_RDI);
    while( true ) {
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::end
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 in_RDI);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                          *)this_00,
                         (__normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                          *)in_RDI);
      uVar3 = (undefined1)((ulong)in_RDX >> 0x38);
      if (!bVar1) break;
      pTVar2 = __gnu_cxx::
               __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
               ::operator->(&local_48);
      TFactor<double>::vars(pTVar2);
      bVar1 = VarSet::operator>>(&this_00->_vs,&in_RDI->_vs);
      uVar3 = (undefined1)((ulong)in_RDX >> 0x38);
      if (bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
      ::operator++((__normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                    *)in_RSI,(int)((ulong)this_00 >> 0x20));
    }
    __gnu_cxx::
    __normal_iterator<const_libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
    ::operator->(&local_48);
    TFactor<double>::marginal(this_01,ns_00,(bool)uVar3);
  }
  return this_00;
}

Assistant:

Factor IJGP::belief( const VarSet &ns ) const {
        vector<Factor>::const_iterator beta;
        for( beta = _Qb.begin(); beta != _Qb.end(); beta++ )
            if( beta->vars() >> ns )
                break;
        if( beta != _Qb.end() )
            return( beta->marginal(ns) );
        else {
            vector<Factor>::const_iterator alpha;
            for( alpha = _Qa.begin(); alpha != _Qa.end(); alpha++ )
                if( alpha->vars() >> ns )
                    break;
            assert( alpha != _Qa.end() );
            return( alpha->marginal(ns) );
        }
    }